

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::merge_with(Tree *this,Tree *src,size_t src_node,size_t dst_node)

{
  undefined1 uVar1;
  Tree *pTVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  uint uVar10;
  NodeType_e NVar11;
  size_t sVar12;
  csubstr *pcVar13;
  size_t sVar14;
  NodeData *pNVar15;
  Tree *pTVar16;
  long lVar17;
  char *extraout_RDX;
  ulong uVar18;
  Tree *pTVar19;
  char *pcVar20;
  undefined8 *puVar21;
  NodeType_e in_R8;
  byte bVar22;
  char msg [31];
  char acStack_1f0 [72];
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  char *pcStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  char *pcStack_168;
  undefined8 uStack_160;
  Tree *pTStack_158;
  ulong uStack_150;
  long lStack_148;
  Tree *pTStack_140;
  Tree *pTStack_138;
  NodeData *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  size_t local_d8;
  undefined1 local_a0;
  size_t local_90;
  Tree *local_88;
  size_t local_80;
  size_t sStack_78;
  char *local_70;
  char *pcStack_68;
  char *local_60;
  size_t local_58;
  size_t sStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  bVar22 = 0;
  sVar12 = dst_node;
  pTVar19 = src;
  pcVar20 = (char *)this;
  if (src == (Tree *)0x0) {
    uStack_e8 = 0x21206372;
    uStack_e4 = 0x756e203d;
    uStack_e0 = 0x74706c6c;
    uStack_dc = CONCAT13(uStack_dc._3_1_,0x2972);
    local_f8 = (NodeData *)0x6166206b63656863;
    uStack_f0 = 0x64656c69;
    uStack_ec = 0x7328203a;
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_58 = 0;
    sStack_50 = 0x662e;
    local_48 = (char *)0x0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = (char *)0x65;
    sVar12 = 0x65;
    pcVar20 = (char *)&stack0xffffffffffffff08;
    pTVar19 = (Tree *)0x1f;
    auVar5 = ZEXT1224(ZEXT412(0x662e) << 0x40);
    LVar7.name.str._0_4_ = 0x1fcdc7;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)(pcVar20,0x1f,LVar7,(this->m_callbacks).m_user_data);
  }
  if (src_node == 0xffffffffffffffff) {
    pcVar20 = (char *)src;
    src_node = root_id(src);
  }
  if (dst_node == 0xffffffffffffffff) {
    pcVar20 = (char *)this;
    dst_node = root_id(this);
  }
  if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_f8 = (NodeData *)0x0;
    uStack_f0 = 0x4b86;
    uStack_ec = 0;
    uStack_e8 = 0;
    uStack_e4 = 0;
    uStack_e0 = 0x1fcdc7;
    uStack_dc = 0;
    local_d8 = 0x65;
    pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
    pTVar19 = (Tree *)0x2e;
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar11 = src->m_buf[src_node].m_type.type;
  if ((NVar11 & VAL) == NOTYPE) {
    if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fcdc7;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar19 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      NVar11 = src->m_buf[src_node].m_type.type;
    }
    if ((NVar11 & SEQ) == NOTYPE) {
      if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fcdc7;
        uStack_dc = 0;
        local_d8 = 0x65;
        pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
        pTVar19 = (Tree *)0x2e;
        (*(code *)PTR_error_impl_0023f548)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        NVar11 = src->m_buf[src_node].m_type.type;
      }
      if ((NVar11 & MAP) == NOTYPE) {
        pcVar20 = 
        "check failed: (src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node))";
        puVar21 = &stack0xffffffffffffff08;
        for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
          *puVar21 = *(undefined8 *)pcVar20;
          pcVar20 = pcVar20 + ((ulong)bVar22 * -2 + 1) * 8;
          puVar21 = puVar21 + (ulong)bVar22 * -2 + 1;
        }
        local_a0 = 0;
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_80 = 0;
        sStack_78 = 0x6633;
        local_70 = (char *)0x0;
        pcStack_68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_60 = (char *)0x65;
        sVar12 = 0x65;
        pcVar20 = (char *)&stack0xffffffffffffff08;
        pTVar19 = (Tree *)0x59;
        auVar5 = ZEXT1224(ZEXT412(0x6633) << 0x40);
        LVar8.name.str._0_4_ = 0x1fcdc7;
        LVar8.super_LineCol.offset = auVar5._0_8_;
        LVar8.super_LineCol.line = auVar5._8_8_;
        LVar8.super_LineCol.col = auVar5._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_callbacks).m_error)(pcVar20,0x59,LVar8,(this->m_callbacks).m_user_data);
      }
    }
  }
  if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_f8 = (NodeData *)0x0;
    uStack_f0 = 0x4b86;
    uStack_ec = 0;
    uStack_e8 = 0;
    uStack_e4 = 0;
    uStack_e0 = 0x1fcdc7;
    uStack_dc = 0;
    local_d8 = 0x65;
    pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
    pTVar19 = (Tree *)0x2e;
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar11 = src->m_buf[src_node].m_type.type;
  if ((NVar11 & VAL) == NOTYPE) {
    if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fcdc7;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar19 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      NVar11 = src->m_buf[src_node].m_type.type;
    }
    local_88 = src;
    if ((NVar11 & SEQ) == NOTYPE) {
      if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fcdc7;
        uStack_dc = 0;
        local_d8 = 0x65;
        pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
        pTVar19 = (Tree *)0x2e;
        (*(code *)PTR_error_impl_0023f548)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        NVar11 = src->m_buf[src_node].m_type.type;
      }
      if ((NVar11 & MAP) == NOTYPE) {
        merge_with();
LAB_001c4492:
        merge_with();
        pTStack_158 = src;
        uStack_150 = src_node;
        lStack_148 = src_node * 0x90;
        pTStack_140 = this;
        pTStack_138 = (Tree *)dst_node;
        bVar9 = has_children((Tree *)pcVar20,(size_t)pTVar19);
        if (bVar9) {
          builtin_strncpy(acStack_1f0,"check failed: (! has_children(node))",0x25);
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          uStack_180 = 0;
          uStack_178 = 0x67ea;
          uStack_170 = 0;
          pcStack_168 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          uStack_160 = 0x65;
          auVar5 = ZEXT1224(ZEXT412(0x67ea) << 0x40);
          LVar4.name.str._0_4_ = 0x1fcdc7;
          LVar4.super_LineCol.offset = auVar5._0_8_;
          LVar4.super_LineCol.line = auVar5._8_8_;
          LVar4.super_LineCol.col = auVar5._16_8_;
          LVar4.name.str._4_4_ = 0;
          LVar4.name.len = 0x65;
          (*(((Tree *)pcVar20)->m_callbacks).m_error)
                    (acStack_1f0,0x25,LVar4,(((Tree *)pcVar20)->m_callbacks).m_user_data);
        }
        sVar14 = parent((Tree *)pcVar20,(size_t)pTVar19);
        if (sVar14 != 0xffffffffffffffff) {
          bVar9 = has_parent((Tree *)pcVar20,(size_t)pTVar19);
          if (!bVar9) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            acStack_1f0[0] = '\0';
            acStack_1f0[1] = '\0';
            acStack_1f0[2] = '\0';
            acStack_1f0[3] = '\0';
            acStack_1f0[4] = '\0';
            acStack_1f0[5] = '\0';
            acStack_1f0[6] = '\0';
            acStack_1f0[7] = '\0';
            acStack_1f0[8] = -0x15;
            acStack_1f0[9] = 'K';
            acStack_1f0[10] = '\0';
            acStack_1f0[0xb] = '\0';
            acStack_1f0[0xc] = '\0';
            acStack_1f0[0xd] = '\0';
            acStack_1f0[0xe] = '\0';
            acStack_1f0[0xf] = '\0';
            acStack_1f0[0x10] = '\0';
            acStack_1f0[0x11] = '\0';
            acStack_1f0[0x12] = '\0';
            acStack_1f0[0x13] = '\0';
            acStack_1f0[0x14] = '\0';
            acStack_1f0[0x15] = '\0';
            acStack_1f0[0x16] = '\0';
            acStack_1f0[0x17] = '\0';
            acStack_1f0[0x18] = -0x39;
            acStack_1f0[0x19] = -0x33;
            acStack_1f0[0x1a] = '\x1f';
            acStack_1f0[0x1b] = '\0';
            acStack_1f0[0x1c] = '\0';
            acStack_1f0[0x1d] = '\0';
            acStack_1f0[0x1e] = '\0';
            acStack_1f0[0x1f] = '\0';
            acStack_1f0[0x20] = 'e';
            acStack_1f0[0x21] = '\0';
            acStack_1f0[0x22] = '\0';
            acStack_1f0[0x23] = '\0';
            acStack_1f0[0x24] = '\0';
            acStack_1f0[0x25] = '\0';
            acStack_1f0[0x26] = '\0';
            acStack_1f0[0x27] = '\0';
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: has_parent(node)",0x1e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          pTVar16 = (Tree *)((Tree *)pcVar20)->m_cap;
          if (pTVar19 == (Tree *)0xffffffffffffffff || pTVar16 <= pTVar19) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            acStack_1f0[0] = '\0';
            acStack_1f0[1] = '\0';
            acStack_1f0[2] = '\0';
            acStack_1f0[3] = '\0';
            acStack_1f0[4] = '\0';
            acStack_1f0[5] = '\0';
            acStack_1f0[6] = '\0';
            acStack_1f0[7] = '\0';
            acStack_1f0[8] = -0x7a;
            acStack_1f0[9] = 'K';
            acStack_1f0[10] = '\0';
            acStack_1f0[0xb] = '\0';
            acStack_1f0[0xc] = '\0';
            acStack_1f0[0xd] = '\0';
            acStack_1f0[0xe] = '\0';
            acStack_1f0[0xf] = '\0';
            acStack_1f0[0x10] = '\0';
            acStack_1f0[0x11] = '\0';
            acStack_1f0[0x12] = '\0';
            acStack_1f0[0x13] = '\0';
            acStack_1f0[0x14] = '\0';
            acStack_1f0[0x15] = '\0';
            acStack_1f0[0x16] = '\0';
            acStack_1f0[0x17] = '\0';
            acStack_1f0[0x18] = -0x39;
            acStack_1f0[0x19] = -0x33;
            acStack_1f0[0x1a] = '\x1f';
            acStack_1f0[0x1b] = '\0';
            acStack_1f0[0x1c] = '\0';
            acStack_1f0[0x1d] = '\0';
            acStack_1f0[0x1e] = '\0';
            acStack_1f0[0x1f] = '\0';
            acStack_1f0[0x20] = 'e';
            acStack_1f0[0x21] = '\0';
            acStack_1f0[0x22] = '\0';
            acStack_1f0[0x23] = '\0';
            acStack_1f0[0x24] = '\0';
            acStack_1f0[0x25] = '\0';
            acStack_1f0[0x26] = '\0';
            acStack_1f0[0x27] = '\0';
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            pTVar16 = (Tree *)((Tree *)pcVar20)->m_cap;
          }
          pNVar15 = ((Tree *)pcVar20)->m_buf;
          pTVar2 = (Tree *)pNVar15[(long)pTVar19].m_parent;
          if ((pTVar2 == (Tree *)0xffffffffffffffff) || (pTVar16 <= pTVar2)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            acStack_1f0[0] = '\0';
            acStack_1f0[1] = '\0';
            acStack_1f0[2] = '\0';
            acStack_1f0[3] = '\0';
            acStack_1f0[4] = '\0';
            acStack_1f0[5] = '\0';
            acStack_1f0[6] = '\0';
            acStack_1f0[7] = '\0';
            acStack_1f0[8] = -0x7a;
            acStack_1f0[9] = 'K';
            acStack_1f0[10] = '\0';
            acStack_1f0[0xb] = '\0';
            acStack_1f0[0xc] = '\0';
            acStack_1f0[0xd] = '\0';
            acStack_1f0[0xe] = '\0';
            acStack_1f0[0xf] = '\0';
            acStack_1f0[0x10] = '\0';
            acStack_1f0[0x11] = '\0';
            acStack_1f0[0x12] = '\0';
            acStack_1f0[0x13] = '\0';
            acStack_1f0[0x14] = '\0';
            acStack_1f0[0x15] = '\0';
            acStack_1f0[0x16] = '\0';
            acStack_1f0[0x17] = '\0';
            acStack_1f0[0x18] = -0x39;
            acStack_1f0[0x19] = -0x33;
            acStack_1f0[0x1a] = '\x1f';
            acStack_1f0[0x1b] = '\0';
            acStack_1f0[0x1c] = '\0';
            acStack_1f0[0x1d] = '\0';
            acStack_1f0[0x1e] = '\0';
            acStack_1f0[0x1f] = '\0';
            acStack_1f0[0x20] = 'e';
            acStack_1f0[0x21] = '\0';
            acStack_1f0[0x22] = '\0';
            acStack_1f0[0x23] = '\0';
            acStack_1f0[0x24] = '\0';
            acStack_1f0[0x25] = '\0';
            acStack_1f0[0x26] = '\0';
            acStack_1f0[0x27] = '\0';
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            pNVar15 = ((Tree *)pcVar20)->m_buf;
          }
          if ((pNVar15[(long)pTVar2].m_type.type & MAP) == NOTYPE) {
            builtin_strncpy(acStack_1f0 + 0x30,"_map(node))",0xc);
            builtin_strncpy(acStack_1f0 + 0x20,"ONE || parent_is",0x10);
            builtin_strncpy(acStack_1f0 + 0x10,"arent(node) == N",0x10);
            builtin_strncpy(acStack_1f0,"check failed: (p",0x10);
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            uStack_1a8 = 0;
            uStack_1a0 = 0x67eb;
            uStack_198 = 0;
            pcStack_190 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            uStack_188 = 0x65;
            auVar5 = ZEXT1224(ZEXT412(0x67eb) << 0x40);
            LVar6.name.str._0_4_ = 0x1fcdc7;
            LVar6.super_LineCol.offset = auVar5._0_8_;
            LVar6.super_LineCol.line = auVar5._8_8_;
            LVar6.super_LineCol.col = auVar5._16_8_;
            LVar6.name.str._4_4_ = 0;
            LVar6.name.len = 0x65;
            (*(((Tree *)pcVar20)->m_callbacks).m_error)
                      (acStack_1f0,0x3c,LVar6,(((Tree *)pcVar20)->m_callbacks).m_user_data);
          }
        }
        _check_next_flags((Tree *)pcVar20,(size_t)pTVar19,in_R8 | KEYSEQ);
        if ((pTVar19 == (Tree *)0xffffffffffffffff) || ((Tree *)((Tree *)pcVar20)->m_cap <= pTVar19)
           ) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          acStack_1f0[0] = '\0';
          acStack_1f0[1] = '\0';
          acStack_1f0[2] = '\0';
          acStack_1f0[3] = '\0';
          acStack_1f0[4] = '\0';
          acStack_1f0[5] = '\0';
          acStack_1f0[6] = '\0';
          acStack_1f0[7] = '\0';
          acStack_1f0[8] = -0x7d;
          acStack_1f0[9] = 'K';
          acStack_1f0[10] = '\0';
          acStack_1f0[0xb] = '\0';
          acStack_1f0[0xc] = '\0';
          acStack_1f0[0xd] = '\0';
          acStack_1f0[0xe] = '\0';
          acStack_1f0[0xf] = '\0';
          acStack_1f0[0x10] = '\0';
          acStack_1f0[0x11] = '\0';
          acStack_1f0[0x12] = '\0';
          acStack_1f0[0x13] = '\0';
          acStack_1f0[0x14] = '\0';
          acStack_1f0[0x15] = '\0';
          acStack_1f0[0x16] = '\0';
          acStack_1f0[0x17] = '\0';
          acStack_1f0[0x18] = -0x39;
          acStack_1f0[0x19] = -0x33;
          acStack_1f0[0x1a] = '\x1f';
          acStack_1f0[0x1b] = '\0';
          acStack_1f0[0x1c] = '\0';
          acStack_1f0[0x1d] = '\0';
          acStack_1f0[0x1e] = '\0';
          acStack_1f0[0x1f] = '\0';
          acStack_1f0[0x20] = 'e';
          acStack_1f0[0x21] = '\0';
          acStack_1f0[0x22] = '\0';
          acStack_1f0[0x23] = '\0';
          acStack_1f0[0x24] = '\0';
          acStack_1f0[0x25] = '\0';
          acStack_1f0[0x26] = '\0';
          acStack_1f0[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar15 = ((Tree *)pcVar20)->m_buf;
        pNVar15[(long)pTVar19].m_type.type = in_R8 | KEYSEQ;
        if ((pTVar19 == (Tree *)0xffffffffffffffff) || ((Tree *)((Tree *)pcVar20)->m_cap <= pTVar19)
           ) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          acStack_1f0[0] = '\0';
          acStack_1f0[1] = '\0';
          acStack_1f0[2] = '\0';
          acStack_1f0[3] = '\0';
          acStack_1f0[4] = '\0';
          acStack_1f0[5] = '\0';
          acStack_1f0[6] = '\0';
          acStack_1f0[7] = '\0';
          acStack_1f0[8] = -0x7d;
          acStack_1f0[9] = 'K';
          acStack_1f0[10] = '\0';
          acStack_1f0[0xb] = '\0';
          acStack_1f0[0xc] = '\0';
          acStack_1f0[0xd] = '\0';
          acStack_1f0[0xe] = '\0';
          acStack_1f0[0xf] = '\0';
          acStack_1f0[0x10] = '\0';
          acStack_1f0[0x11] = '\0';
          acStack_1f0[0x12] = '\0';
          acStack_1f0[0x13] = '\0';
          acStack_1f0[0x14] = '\0';
          acStack_1f0[0x15] = '\0';
          acStack_1f0[0x16] = '\0';
          acStack_1f0[0x17] = '\0';
          acStack_1f0[0x18] = -0x39;
          acStack_1f0[0x19] = -0x33;
          acStack_1f0[0x1a] = '\x1f';
          acStack_1f0[0x1b] = '\0';
          acStack_1f0[0x1c] = '\0';
          acStack_1f0[0x1d] = '\0';
          acStack_1f0[0x1e] = '\0';
          acStack_1f0[0x1f] = '\0';
          acStack_1f0[0x20] = 'e';
          acStack_1f0[0x21] = '\0';
          acStack_1f0[0x22] = '\0';
          acStack_1f0[0x23] = '\0';
          acStack_1f0[0x24] = '\0';
          acStack_1f0[0x25] = '\0';
          acStack_1f0[0x26] = '\0';
          acStack_1f0[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          pNVar15 = ((Tree *)pcVar20)->m_buf;
        }
        pNVar15[(long)pTVar19].m_key.tag.str = (char *)0x0;
        pNVar15[(long)pTVar19].m_key.tag.len = 0;
        pNVar15[(long)pTVar19].m_key.scalar.str = extraout_RDX;
        pNVar15[(long)pTVar19].m_key.scalar.len = sVar12;
        pcVar13 = &pNVar15[(long)pTVar19].m_key.anchor;
        pcVar13->str = (char *)0x0;
        pcVar13->len = 0;
        if ((pTVar19 == (Tree *)0xffffffffffffffff) || ((Tree *)((Tree *)pcVar20)->m_cap <= pTVar19)
           ) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          acStack_1f0[0] = '\0';
          acStack_1f0[1] = '\0';
          acStack_1f0[2] = '\0';
          acStack_1f0[3] = '\0';
          acStack_1f0[4] = '\0';
          acStack_1f0[5] = '\0';
          acStack_1f0[6] = '\0';
          acStack_1f0[7] = '\0';
          acStack_1f0[8] = -0x7d;
          acStack_1f0[9] = 'K';
          acStack_1f0[10] = '\0';
          acStack_1f0[0xb] = '\0';
          acStack_1f0[0xc] = '\0';
          acStack_1f0[0xd] = '\0';
          acStack_1f0[0xe] = '\0';
          acStack_1f0[0xf] = '\0';
          acStack_1f0[0x10] = '\0';
          acStack_1f0[0x11] = '\0';
          acStack_1f0[0x12] = '\0';
          acStack_1f0[0x13] = '\0';
          acStack_1f0[0x14] = '\0';
          acStack_1f0[0x15] = '\0';
          acStack_1f0[0x16] = '\0';
          acStack_1f0[0x17] = '\0';
          acStack_1f0[0x18] = -0x39;
          acStack_1f0[0x19] = -0x33;
          acStack_1f0[0x1a] = '\x1f';
          acStack_1f0[0x1b] = '\0';
          acStack_1f0[0x1c] = '\0';
          acStack_1f0[0x1d] = '\0';
          acStack_1f0[0x1e] = '\0';
          acStack_1f0[0x1f] = '\0';
          acStack_1f0[0x20] = 'e';
          acStack_1f0[0x21] = '\0';
          acStack_1f0[0x22] = '\0';
          acStack_1f0[0x23] = '\0';
          acStack_1f0[0x24] = '\0';
          acStack_1f0[0x25] = '\0';
          acStack_1f0[0x26] = '\0';
          acStack_1f0[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar15 = ((Tree *)pcVar20)->m_buf;
        pcVar13 = &pNVar15[(long)pTVar19].m_val.anchor;
        pcVar13->str = (char *)0x0;
        pcVar13->len = 0;
        pcVar13 = &pNVar15[(long)pTVar19].m_val.scalar;
        pcVar13->str = (char *)0x0;
        pcVar13->len = 0;
        pNVar15[(long)pTVar19].m_val.tag.str = (char *)0x0;
        pNVar15[(long)pTVar19].m_val.tag.len = 0;
        return;
      }
      if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fcdc7;
        uStack_dc = 0;
        local_d8 = 0x65;
        (*(code *)PTR_error_impl_0023f548)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_90 = dst_node * 0x90;
      if ((this->m_buf[dst_node].m_type.type & MAP) == NOTYPE) {
        bVar9 = has_children(this,dst_node);
        if (bVar9) {
          remove_children(this,dst_node);
        }
        if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b83;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        *(undefined8 *)((long)&(this->m_buf->m_type).type + local_90) = 0;
        if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b86;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((src->m_buf[src_node].m_type.type & KEY) == NOTYPE) {
          to_map(this,dst_node,0);
        }
        else {
          pcVar13 = key(src,src_node);
          to_map(this,dst_node,*pcVar13,0);
        }
      }
      for (sVar12 = first_child(src,src_node); sVar12 != 0xffffffffffffffff;
          sVar12 = next_sibling(src,sVar12)) {
        pcVar13 = key(src,sVar12);
        sVar14 = find_child(this,dst_node,pcVar13);
        if (sVar14 == 0xffffffffffffffff) {
          pTVar19 = (Tree *)this->m_cap;
          if (dst_node < pTVar19 && (Tree *)dst_node != (Tree *)0xffffffffffffffff) {
            pNVar15 = this->m_buf;
            uVar18 = *(ulong *)((long)&pNVar15->m_last_child + local_90);
LAB_001c4136:
            if (pTVar19 <= dst_node) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              local_f8 = (NodeData *)0x0;
              uStack_f0 = 0x4b86;
              uStack_ec = 0;
              uStack_e8 = 0;
              uStack_e4 = 0;
              uStack_e0 = 0x1fcdc7;
              uStack_dc = 0;
              local_d8 = 0x65;
              (*(code *)PTR_error_impl_0023f548)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
              pNVar15 = this->m_buf;
            }
            uVar1 = *(byte *)((long)&(pNVar15->m_type).type + local_90);
          }
          else {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b83;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            pNVar15 = this->m_buf;
            uVar18 = *(ulong *)((long)&pNVar15->m_last_child + local_90);
            if ((Tree *)dst_node != (Tree *)0xffffffffffffffff) {
              pTVar19 = (Tree *)this->m_cap;
              goto LAB_001c4136;
            }
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4cb1;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: parent != NONE",0x1c,
                       (anonymous_namespace)::s_default_callbacks);
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b86;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            uVar1 = (undefined1)this->m_buf[-1].m_type.type;
          }
          if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar9 = is_root(this,dst_node), !bVar9)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4cb2;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: is_container(parent) || is_root(parent)",0x35,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if (uVar18 != 0xffffffffffffffff) {
            if (this->m_cap <= uVar18) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              local_f8 = (NodeData *)0x0;
              uStack_f0 = 0x4b83;
              uStack_ec = 0;
              uStack_e8 = 0;
              uStack_e4 = 0;
              uStack_e0 = 0x1fcdc7;
              uStack_dc = 0;
              local_d8 = 0x65;
              (*(code *)PTR_error_impl_0023f548)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if ((Tree *)this->m_buf[uVar18].m_parent != (Tree *)dst_node) {
              if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              local_f8 = (NodeData *)0x0;
              uStack_f0 = 0x4cb3;
              uStack_ec = 0;
              uStack_e8 = 0;
              uStack_e4 = 0;
              uStack_e0 = 0x1fcdc7;
              uStack_dc = 0;
              local_d8 = 0x65;
              (*(code *)PTR_error_impl_0023f548)
                        ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                         (anonymous_namespace)::s_default_callbacks);
            }
          }
          sVar14 = _claim(this);
          _set_hierarchy(this,sVar14,dst_node,uVar18);
          src = local_88;
          _copy_props(this,sVar14,local_88,sVar12);
        }
        merge_with(this,src,sVar12,sVar14);
      }
    }
    else {
      if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fcdc7;
        uStack_dc = 0;
        local_d8 = 0x65;
        (*(code *)PTR_error_impl_0023f548)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_90 = dst_node * 0x90;
      if ((this->m_buf[dst_node].m_type.type & SEQ) == NOTYPE) {
        bVar9 = has_children(this,dst_node);
        if (bVar9) {
          remove_children(this,dst_node);
        }
        if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b83;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        *(undefined8 *)((long)&(this->m_buf->m_type).type + local_90) = 0;
        if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b86;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((src->m_buf[src_node].m_type.type & KEY) == NOTYPE) {
          to_seq(this,dst_node,0);
        }
        else {
          pcVar13 = key(src,src_node);
          to_seq(this,dst_node,*pcVar13,0);
        }
      }
      for (sVar12 = first_child(src,src_node); sVar12 != 0xffffffffffffffff;
          sVar12 = next_sibling(pTVar19,sVar12)) {
        pTVar19 = (Tree *)this->m_cap;
        if (dst_node < pTVar19 && (Tree *)dst_node != (Tree *)0xffffffffffffffff) {
          pNVar15 = this->m_buf;
          uVar18 = *(ulong *)((long)&pNVar15->m_last_child + local_90);
LAB_001c3cbc:
          if (pTVar19 <= dst_node) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b86;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
            pNVar15 = this->m_buf;
          }
          uVar1 = *(byte *)((long)&(pNVar15->m_type).type + local_90);
        }
        else {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b83;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          pNVar15 = this->m_buf;
          uVar18 = *(ulong *)((long)&pNVar15->m_last_child + local_90);
          if ((Tree *)dst_node != (Tree *)0xffffffffffffffff) {
            pTVar19 = (Tree *)this->m_cap;
            goto LAB_001c3cbc;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4cb1;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b86;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          uVar1 = (undefined1)this->m_buf[-1].m_type.type;
        }
        if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar9 = is_root(this,dst_node), !bVar9)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4cb2;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fcdc7;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if (uVar18 != 0xffffffffffffffff) {
          if (this->m_cap <= uVar18) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b83;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if ((Tree *)this->m_buf[uVar18].m_parent != (Tree *)dst_node) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4cb3;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fcdc7;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_0023f548)
                      ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                       (anonymous_namespace)::s_default_callbacks);
          }
        }
        sVar14 = _claim(this);
        _set_hierarchy(this,sVar14,dst_node,uVar18);
        pTVar19 = local_88;
        _copy_props_wo_key(this,sVar14,local_88,sVar12);
        merge_with(this,pTVar19,sVar12,sVar14);
      }
    }
  }
  else {
    if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fcdc7;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar19 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (((this->m_buf[dst_node].m_type.type & VAL) == NOTYPE) &&
       (pTVar19 = (Tree *)dst_node, pcVar20 = (char *)this, bVar9 = has_children(this,dst_node),
       bVar9)) {
      pTVar19 = (Tree *)dst_node;
      pcVar20 = (char *)this;
      remove_children(this,dst_node);
    }
    if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fcdc7;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar19 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar10 = (uint)src->m_buf[src_node].m_type.type;
    sVar12 = (size_t)~uVar10;
    if ((~uVar10 & 3) == 0) {
      _copy_props(this,dst_node,src,src_node);
    }
    else {
      if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fcdc7;
        uStack_dc = 0;
        local_d8 = 0x65;
        pcVar20 = "check failed: i != NONE && i >= 0 && i < m_cap";
        pTVar19 = (Tree *)0x2e;
        (*(code *)PTR_error_impl_0023f548)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        uVar10 = (uint)src->m_buf[src_node].m_type.type;
      }
      if ((uVar10 & 3) != 1) goto LAB_001c4492;
      _copy_props_wo_key(this,dst_node,src,src_node);
    }
  }
  return;
}

Assistant:

void Tree::merge_with(Tree const *src, size_t src_node, size_t dst_node)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    if(src_node == NONE)
        src_node = src->root_id();
    if(dst_node == NONE)
        dst_node = root_id();
    _RYML_CB_ASSERT(m_callbacks, src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node));

    if(src->has_val(src_node))
    {
        if( ! has_val(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
        }
        if(src->is_keyval(src_node))
            _copy_props(dst_node, src, src_node);
        else if(src->is_val(src_node))
            _copy_props_wo_key(dst_node, src, src_node);
        else
            C4_NEVER_REACH();
    }
    else if(src->is_seq(src_node))
    {
        if( ! is_seq(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_seq(dst_node, src->key(src_node));
            else
                to_seq(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = append_child(dst_node);
            _copy_props_wo_key(dch, src, sch);
            merge_with(src, sch, dch);
        }
    }
    else if(src->is_map(src_node))
    {
        if( ! is_map(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_map(dst_node, src->key(src_node));
            else
                to_map(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = find_child(dst_node, src->key(sch));
            if(dch == NONE)
            {
                dch = append_child(dst_node);
                _copy_props(dch, src, sch);
            }
            merge_with(src, sch, dch);
        }
    }
    else
    {
        C4_NEVER_REACH();
    }
}